

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O3

Transaction * __thiscall
cfd::core::Block::GetTransaction(Transaction *__return_storage_ptr__,Block *this,Txid *txid)

{
  bool bVar1;
  CfdException *this_00;
  ulong uVar2;
  pointer pTVar3;
  long lVar4;
  long lVar5;
  string local_50;
  
  pTVar3 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar3) {
    lVar5 = 0;
    lVar4 = 0;
    uVar2 = 0;
    do {
      bVar1 = Txid::Equals(txid,(Txid *)((long)&pTVar3->_vptr_Txid + lVar5));
      if (bVar1) {
        Transaction::Transaction
                  (__return_storage_ptr__,
                   (ByteData *)
                   ((long)&(((this->txs_).
                             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                             ._M_impl.super__Vector_impl_data._M_start)->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + lVar4));
        return __return_storage_ptr__;
      }
      uVar2 = uVar2 + 1;
      pTVar3 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x18;
      lVar5 = lVar5 + 0x20;
    } while (uVar2 < (ulong)((long)(this->txids_).
                                   super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 5));
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"target txid not found.","")
  ;
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_50);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Transaction Block::GetTransaction(const Txid& txid) const {
  for (size_t index = 0; index < txids_.size(); ++index) {
    if (txid.Equals(txids_[index])) {
      return Transaction(txs_[index]);
    }
  }
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "target txid not found.");
}